

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansv.hpp
# Opt level: O2

void ansv<unsigned_long,2,0,0>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *in,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *left_nsv,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *right_nsv,
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *lr_mins,comm *comm,size_t nonsv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  unsigned_long uVar5;
  ulong uVar6;
  uint __line;
  unsigned_long *puVar7;
  _Map_pointer pppVar8;
  unsigned_long prefix;
  size_type sVar9;
  size_type sVar10;
  _Elt_pointer ppVar11;
  long lVar12;
  _Elt_pointer ppVar13;
  _Elt_pointer ppVar14;
  _Elt_pointer ppVar15;
  unsigned_long uVar16;
  ulong uVar17;
  ulong uVar18;
  char *__assertion;
  pointer ppVar19;
  ulong uVar20;
  ulong uVar21;
  size_t i_1;
  long lVar22;
  _Map_pointer pppVar23;
  size_t i;
  ulong uVar24;
  pointer ppVar25;
  _Elt_pointer ppVar26;
  bool bVar27;
  reverse_iterator it2;
  deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  q;
  unsigned_long local_min;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  recved;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_160;
  long local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> allmins;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_d8;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_b8;
  _Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>
  local_98;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_78;
  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
  local_58;
  
  std::
  _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_Deque_base(&q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               );
  local_size = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start >> 3;
  prefix = mxx::exscan<unsigned_long,std::plus<unsigned_long>>(&local_size,comm);
  lVar12 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
LAB_00135e83:
  lVar22 = lVar12 + -1;
  if (lVar12 != 0) {
    while (q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           q.
           super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      ppVar11 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar11 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      if (ppVar11[-1].first <=
          (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar22]) break;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    }
    do {
      puVar4 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_00135f1c;
      ppVar11 = q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          q.
          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppVar11 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      if (puVar4[lVar22] != ppVar11[-1].first) goto LAB_00135f1c;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::pop_back(&q);
    } while( true );
  }
  local_58.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_58.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_first;
  local_58.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_last;
  local_58.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_78.current._M_cur =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_78.current._M_first =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_first;
  local_78.current._M_last =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_78.current._M_node =
       q.
       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       ._M_impl.super__Deque_impl_data._M_start._M_node;
  std::
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::
  vector<std::reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>>,void>
            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&it2,&local_58,&local_78,(allocator_type *)&local_160);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::_M_move_assign(lr_mins,&it2);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)&it2);
  sVar9 = std::
          deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(&q);
  if (sVar9 == 0) {
    __assertion = "n_left_mins >= 1";
    __line = 0x60;
  }
  else {
    std::
    deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear(&q);
    uVar24 = 0;
LAB_00135fda:
    if (uVar24 < (ulong)((long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(in->
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3)) {
      while (q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        ppVar11 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar11 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        if (ppVar11[-1].first <=
            (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar24]) break;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      }
      do {
        sVar10 = std::
                 deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::size(&q);
        if (sVar10 < 2) goto LAB_001360d5;
        ppVar11 = q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppVar11 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        uVar5 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar24];
        if (uVar5 != ppVar11[-1].first) goto LAB_001360d5;
        local_160.current._M_cur =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        local_160.current._M_first =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
        local_160.current._M_last =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last;
        local_160.current._M_node =
             q.
             super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
        std::
        reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
        ::operator+((reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                     *)&it2,&local_160,1);
        ppVar11 = it2.current._M_cur;
        if (it2.current._M_cur == it2.current._M_first) {
          ppVar11 = it2.current._M_node[-1] + 0x20;
        }
        if (uVar5 != ppVar11[-1].first) goto LAB_001360d5;
        std::
        deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::pop_back(&q);
      } while( true );
    }
    sVar10 = std::
             deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::size(&q);
    local_98._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_98._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_first;
    local_98._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_98._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_start._M_node;
    local_b8._M_cur =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_b8._M_first =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_b8._M_last =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_b8._M_node =
         q.
         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
    ::
    insert<std::_Deque_iterator<std::pair<unsigned_long,unsigned_long>,std::pair<unsigned_long,unsigned_long>&,std::pair<unsigned_long,unsigned_long>*>,void>
              ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)lr_mins,
               (lr_mins->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,&local_98,&local_b8);
    local_min = (q.
                 super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->first;
    if (sVar10 != 0) {
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      if (sVar10 + sVar9 !=
          (long)(lr_mins->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(lr_mins->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4) {
        __assertion = "n_right_mins + n_left_mins == lr_mins.size()";
        __line = 0x78;
        goto LAB_001369e0;
      }
      mxx::allgather<unsigned_long>(&allmins,&local_min,comm);
      it2.current._M_cur = (_Elt_pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_counts,(long)comm->m_size,(value_type_conflict *)&it2,
                 (allocator_type *)&local_160);
      it2.current._M_cur = (_Elt_pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&send_displs,(long)comm->m_size,(value_type_conflict *)&it2,
                 (allocator_type *)&local_160);
      iVar2 = comm->m_rank;
      lVar12 = (long)iVar2;
      if (0 < lVar12) {
        uVar18 = 0;
        lVar22 = lVar12;
        uVar24 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + -1];
        do {
          do {
            uVar21 = uVar18;
            if (lVar22 < 1) goto LAB_00136298;
            lVar22 = lVar22 + -1;
            uVar20 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar22];
            uVar5 = 1;
            uVar6 = uVar21;
            ppVar25 = (lr_mins->
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar21;
            do {
              uVar18 = uVar6;
              uVar16 = uVar5;
              if (sVar9 <= uVar18 + 1) break;
              puVar7 = &ppVar25->first;
              uVar5 = uVar16 + 1;
              uVar6 = uVar18 + 1;
              ppVar25 = ppVar25 + 1;
            } while (uVar20 <= *puVar7);
          } while (uVar24 < uVar20);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] = uVar16;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar22] = uVar21;
          uVar24 = uVar20;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22]);
      }
LAB_00136298:
      iVar3 = comm->m_size;
      if (iVar2 < iVar3 + -1) {
        ppVar25 = (lr_mins->
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar18 = (long)(lr_mins->
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar25 >> 4;
        sVar10 = uVar18 - 1;
        lVar22 = lVar12;
        uVar24 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12 + 1];
        do {
          do {
            lVar1 = lVar22 + 1;
            if (iVar3 <= lVar1) goto LAB_00136386;
            uVar21 = sVar10;
            if (lVar12 < lVar22) {
              ppVar19 = ppVar25 + sVar10 + 1;
              uVar20 = sVar10;
              do {
                uVar21 = uVar20;
                if (uVar18 <= uVar21 + 1) break;
                puVar7 = &ppVar19->first;
                ppVar19 = ppVar19 + 1;
                uVar20 = uVar21 + 1;
              } while (*puVar7 <= uVar24);
            }
            uVar20 = sVar10;
            if (sVar9 < sVar10) {
              uVar20 = sVar9;
            }
            uVar6 = allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar1];
            for (ppVar19 = ppVar25 + sVar10;
                (uVar17 = uVar20, sVar9 < sVar10 && (uVar17 = sVar10, uVar6 <= ppVar19->first));
                ppVar19 = ppVar19 + -1) {
              sVar10 = sVar10 - 1;
            }
            sVar10 = uVar17;
            lVar22 = lVar1;
          } while (uVar24 < uVar6);
          send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1] = (uVar21 - uVar17) + 1;
          send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar1] = uVar17;
          uVar24 = uVar6;
        } while (local_min <=
                 allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar1]);
      }
LAB_00136386:
      mxx::all2all<unsigned_long>(&recv_counts,&send_counts,comm);
      mxx::impl::get_displacements<unsigned_long>(&recv_displs,&recv_counts);
      uVar5 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      uVar16 = recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_finish[-1];
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector(&recved,uVar5 + uVar16,(allocator_type *)&it2);
      mxx::all2allv<std::pair<unsigned_long,unsigned_long>>
                ((lr_mins->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,&send_counts,&send_displs,
                 recved.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,&recv_counts,&recv_displs,comm);
      uVar24 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start[comm->m_rank];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(left_nsv,local_size);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(right_nsv,local_size);
      local_140 = (uVar5 + uVar16) - uVar24;
      std::
      deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::clear(&q);
      lVar22 = (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                     .super__Vector_impl_data._M_start;
      lVar12 = lVar22 >> 3;
      while( true ) {
        lVar12 = lVar12 + -1;
        lVar22 = lVar22 + -8;
        if (lVar12 == -1) break;
        update_nsv_queue<unsigned_long,2>
                  (left_nsv,&q,
                   (unsigned_long *)
                   ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                          _M_impl.super__Vector_impl_data._M_start + lVar22),
                   (size_t)(prefix + lVar12),prefix);
        it2.current._M_cur =
             (_Elt_pointer)
             (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[lVar12];
        it2.current._M_first = (_Elt_pointer)(prefix + lVar12);
        std::
        deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                    *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
      }
      lVar12 = uVar24 * 0x10;
      uVar18 = 0;
      do {
        if ((uVar24 <= uVar18) ||
           (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
          ppVar11 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
          pppVar23 = q.
                     super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
          ppVar26 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          do {
            ppVar13 = ppVar26;
            ppVar15 = ppVar11;
            ppVar14 = q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last;
            pppVar8 = pppVar23;
            if (ppVar26 ==
                q.
                super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::clear(&q);
              lVar22 = 0;
              for (uVar24 = 0;
                  puVar4 = (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                  uVar24 < (ulong)((long)(in->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4
                                  >> 3); uVar24 = uVar24 + 1) {
                update_nsv_queue<unsigned_long,0>
                          (right_nsv,&q,(unsigned_long *)((long)puVar4 + lVar22),
                           (size_t)(prefix + uVar24),prefix);
                it2.current._M_cur =
                     *(_Elt_pointer *)
                      ((long)(in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                             ._M_impl.super__Vector_impl_data._M_start + lVar22);
                it2.current._M_first = (_Elt_pointer)(prefix + uVar24);
                std::
                deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                          ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                            *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
                lVar22 = lVar22 + 8;
              }
              lVar22 = local_140;
              while ((bVar27 = lVar22 != 0, lVar22 = lVar22 + -1, bVar27 &&
                     (q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                      q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur))) {
                update_nsv_queue<unsigned_long,0>
                          (right_nsv,&q,
                           (unsigned_long *)
                           ((long)&(recved.
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first + lVar12),
                           *(size_t *)
                            ((long)&(recved.
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->second + lVar12),
                           prefix);
                lVar12 = lVar12 + 0x10;
              }
              puVar4 = (right_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              for (; q.
                     super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                     q.
                     super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       q.
                       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur + -1) {
                if (q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first =
                       q.
                       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node =
                       q.
                       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
                  puVar4[q.
                         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_first[0x1f].second - prefix] =
                       nonsv;
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       q.
                       super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first + 0x20;
                }
                else {
                  puVar4[q.
                         super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].second - prefix] =
                       nonsv;
                }
              }
              std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::operator=(lr_mins,&recved);
              std::
              _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::~_Vector_base(&recved.
                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             );
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&recv_displs.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&recv_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&send_displs.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&send_counts.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&allmins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
              ;
              std::
              _Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::~_Deque_base(&q.
                              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            );
              return;
            }
            while (it2.current._M_node = pppVar8, it2.current._M_last = ppVar14,
                  it2.current._M_first = ppVar15, it2.current._M_cur = ppVar13,
                  std::
                  reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
                  ::operator+(&local_160,&it2,1),
                  local_160.current._M_cur !=
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ppVar13 = ppVar26;
              if (ppVar26 == ppVar11) {
                ppVar13 = pppVar23[-1] + 0x20;
              }
              uVar5 = ppVar13[-1].first;
              std::
              reverse_iterator<std::_Deque_iterator<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>_&,_std::pair<unsigned_long,_unsigned_long>_*>_>
              ::operator+(&local_d8,&it2,1);
              ppVar13 = local_d8.current._M_cur;
              if (local_d8.current._M_cur == local_d8.current._M_first) {
                ppVar13 = local_d8.current._M_node[-1] + 0x20;
              }
              if (uVar5 != ppVar13[-1].first) break;
              if (it2.current._M_cur == it2.current._M_first) {
                it2.current._M_first = it2.current._M_node[-1];
                it2.current._M_cur = it2.current._M_first + 0x20;
                it2.current._M_last = it2.current._M_cur;
                it2.current._M_node = it2.current._M_node + -1;
              }
              ppVar13 = it2.current._M_cur + -1;
              ppVar15 = ppVar26;
              if (ppVar26 == ppVar11) {
                ppVar15 = pppVar23[-1] + 0x20;
              }
              ppVar14 = ppVar13;
              if (ppVar13 == it2.current._M_first) {
                ppVar14 = it2.current._M_node[-1] + 0x20;
              }
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar14[-1].second - prefix] = ppVar15[-1].second;
              ppVar15 = it2.current._M_first;
              ppVar14 = it2.current._M_last;
              pppVar8 = it2.current._M_node;
            }
            if (ppVar26 == ppVar11) {
              ppVar26 = pppVar23[-1] + 0x20;
            }
            (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[ppVar26[-1].second - prefix] = nonsv;
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_last = it2.current._M_last;
            ppVar11 = it2.current._M_first;
            pppVar23 = it2.current._M_node;
            ppVar26 = it2.current._M_cur;
            if (it2.current._M_cur == it2.current._M_first) {
              q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_last = it2.current._M_node[-1] + 0x20;
              ppVar11 = it2.current._M_node[-1];
              pppVar23 = it2.current._M_node + -1;
              ppVar26 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_last;
            }
            ppVar26 = ppVar26 + -1;
          } while( true );
        }
        lVar22 = ~uVar18 + uVar24;
        update_nsv_queue<unsigned_long,2>
                  (left_nsv,&q,
                   &recved.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar22].first,
                   recved.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar22].second,prefix);
        uVar21 = uVar18;
        if (q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            q.
            super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppVar11 = q.
                    super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              q.
              super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppVar11 = q.
                      super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          if (recved.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar22].first == ppVar11[-1].first) {
            for (lVar22 = lVar12 + uVar18 * -0x10;
                (uVar21 = uVar24 - 1, uVar24 - 1 != uVar18 &&
                (uVar21 = uVar18,
                *(long *)((long)&recved.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar22) ==
                *(long *)((long)&recved.
                                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-2].first + lVar22)));
                lVar22 = lVar22 + -0x10) {
              uVar18 = uVar18 + 1;
            }
            while (q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   q.
                   super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              ppVar11 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar11 = q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              if (ppVar11[-1].first !=
                  *(unsigned_long *)
                   ((long)&recved.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].first + lVar22)) break;
              ppVar11 = q.
                        super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                  q.
                  super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                ppVar11 = q.
                          super__Deque_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              (left_nsv->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[ppVar11[-1].second - prefix] =
                   *(unsigned_long *)
                    ((long)recved.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8);
              std::
              deque<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::pop_back(&q);
            }
          }
        }
        uVar18 = uVar21 + 1;
      } while( true );
    }
    __assertion = "n_right_mins >= 1";
    __line = 0x76;
  }
LAB_001369e0:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/ansv.hpp"
                ,__line,
                "void ansv(const std::vector<T> &, std::vector<size_t> &, std::vector<size_t> &, std::vector<std::pair<T, size_t>> &, const mxx::comm &, size_t) [T = unsigned long, left_type = 2, right_type = 0, indexing_type = 0]"
               );
LAB_00135f1c:
  it2.current._M_first = (_Elt_pointer)(lVar12 + (prefix - 1));
  it2.current._M_cur = (_Elt_pointer)puVar4[lVar22];
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
  lVar12 = lVar22;
  goto LAB_00135e83;
LAB_001360d5:
  it2.current._M_first = (_Elt_pointer)(prefix + uVar24);
  it2.current._M_cur =
       (_Elt_pointer)
       (in->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start[uVar24];
  std::
  deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  ::emplace_back<std::pair<unsigned_long,unsigned_long>>
            ((deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              *)&q,(pair<unsigned_long,_unsigned_long> *)&it2);
  uVar24 = uVar24 + 1;
  goto LAB_00135fda;
}

Assistant:

void ansv(const std::vector<T>& in, std::vector<size_t>& left_nsv, std::vector<size_t>& right_nsv, std::vector<std::pair<T,size_t> >& lr_mins, const mxx::comm& comm, size_t nonsv = 0) {
    std::deque<std::pair<T,size_t> > q;
    size_t local_size = in.size();
    size_t prefix = mxx::exscan(local_size, comm);

    /*****************************************************************
     *  Step 1: Locally calculate ANSV and save un-matched elements  *
     *****************************************************************/

    // backwards direction (left mins)
    for (size_t i = in.size(); i > 0; --i) {
        while (!q.empty() && in[i-1] < q.back().first)
            q.pop_back();
        if (right_type == furthest_eq) {
            // remove all equal elements but the last
            while (q.size() >= 2 && in[i-1] == q.back().first && in[i-1] == (q.rbegin()+1)->first) {
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i-1] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
    }
    // add results to left_mins
    lr_mins = std::vector<std::pair<T,size_t>>(q.rbegin(), q.rend());
    size_t n_left_mins = q.size();
    assert(n_left_mins >= 1);
    q.clear();

    // forward direction (right mins)
    for (size_t i = 0; i < in.size(); ++i) {
        while (!q.empty() && in[i] < q.back().first)
            q.pop_back();
        if (left_type == furthest_eq) {
            while (q.size() >= 2 && in[i] == q.back().first && in[i] == (q.rbegin()+1)->first) {
                // remove all but the last one that is equal, TODO: can be `if` instead
                q.pop_back();
            }
        } else {
            while (!q.empty() && in[i] == q.back().first)
                q.pop_back();
        }
        q.push_back(std::pair<T, size_t>(in[i], prefix+i));
    }
    // add results to right_mins
    size_t n_right_mins = q.size();
    lr_mins.insert(lr_mins.end(), q.begin(), q.end());
    T local_min = q.front().first;
    assert(n_right_mins >= 1);
    q.clear();
    assert(n_right_mins + n_left_mins == lr_mins.size());

    /***************************************************************
     *  Step 2: communicate un-matched elements to correct target  *
     ***************************************************************/

    // allgather min and max of all left and right mins
    //assert(local_min == lr_mins.front().first);
    std::vector<T> allmins = mxx::allgather(local_min, comm);
    std::vector<size_t> send_counts(comm.size(), 0);
    std::vector<size_t> send_displs(comm.size(), 0);

    // calculate which processor to exchange unmatched left_mins and right_mins with
    // 1) calculate communication parameters for left processes
    if (comm.rank() > 0) {
        size_t left_idx = 0;
        T prev_mins_min = allmins[comm.rank()-1];
        for (int i = comm.rank()-1; i >= 0; --i) {
            size_t start_idx = left_idx;
            // move start back to other `equal` elements (there can be at most 2)
            if (right_type == furthest_eq && i < comm.rank()-1) {
                if (start_idx > 0 && lr_mins[start_idx-1].first <= prev_mins_min) {
                    --start_idx;
                }
            }
            while (left_idx+1 < n_left_mins && lr_mins[left_idx].first >= allmins[i]) {
                ++left_idx;
            }
            // don't send anything if min is dominated by previous
            if (allmins[i] > prev_mins_min) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // send all from [left_idx, start_idx] (inclusive) to proc `i`
            send_counts[i] = left_idx - start_idx + 1;
            send_displs[i] = start_idx;

            // set comm parameters
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // 2) calculate communication parameters for right process
    if (comm.rank() < comm.size()-1) {
        size_t right_idx = lr_mins.size()-1; // n_left_mins;
        T prev_mins_min = allmins[comm.rank()+1];
        for (int i = comm.rank()+1; i < comm.size(); ++i) {
            // find the range which should be send
            size_t end_idx = right_idx;
            if (left_type == furthest_eq && i > comm.rank()+1) {
                // move start back to other `equal` elements
                while (end_idx+1 < lr_mins.size() && lr_mins[end_idx+1].first <= prev_mins_min) {
                    ++end_idx;
                }
            }
            while (right_idx > n_left_mins && lr_mins[right_idx].first >= allmins[i]) {
                --right_idx;
            }

            // don't send if the minimum of `i` is dominated by a prev min right of me
            if (prev_mins_min < allmins[i]) {
                continue;
            } else {
                prev_mins_min = allmins[i];
            }

            // now right_idx is the first one that is smaller than the min of `i`
            // send all elements from [start_idx, right_idx]
            send_counts[i] = end_idx - right_idx + 1;
            send_displs[i] = right_idx;

            // can stop if an overall smaller min than my own has been found
            if (allmins[i] < local_min) {
                break;
            }
        }
    }

    // exchange lr_mins via all2all
    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
    size_t recv_size = recv_counts.back() + recv_displs.back();
    std::vector<std::pair<T, size_t>> recved(recv_size);
    mxx::all2allv(&lr_mins[0], send_counts, send_displs, &recved[0], recv_counts, recv_displs, comm);

    // solve locally given the exchanged values (by prefilling min-queue before running locally)
    size_t n_left_recv = recv_displs[comm.rank()];
    size_t n_right_recv = recv_size - n_left_recv;


    /***************************************************************
     *  Step 3: Again solve ANSV locally and use lr_mins as tails  *
     ***************************************************************/

    left_nsv.resize(local_size);
    right_nsv.resize(local_size);

    q.clear();
    // iterate backwards to get the nearest smaller element to left for each element
    // TODO: this doesn't really require pairs in the queue (index suffices)
    for (size_t i = in.size(); i > 0; --i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], prefix+i-1, prefix);
            q.push_back(std::pair<T, size_t>(in[i-1], prefix+i-1));
        } else { // indexing_type == local_indexing
            // prefix=0 for local indexing
            update_nsv_queue<T,left_type>(left_nsv, q, in[i-1], i-1, 0);
            q.push_back(std::pair<T, size_t>(in[i-1], i-1));
        }
    }

    // now go backwards through the right-mins from the previous processors,
    // in order to resolve all local elements
    for (size_t i = 0; i < n_left_recv; ++i) {
        if (q.empty()) {
            break;
        }
        size_t rcv_idx = n_left_recv - i - 1;

        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            // prefix = 0, recv.2nd = local_size+rcv_idx,
            update_nsv_queue<T,left_type>(left_nsv, q, recved[rcv_idx].first, local_size + rcv_idx, 0);
        }

        if (left_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (rcv_idx != 0 && recved[rcv_idx].first == recved[rcv_idx-1].first) {
                    i++;
                    rcv_idx = n_left_recv - i - 1;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        left_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        left_nsv[q.back().second] = local_size + rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    //  -> set these to a special value and handle case if furthest_eq
    //     elements are still waiting in queue
    const size_t iprefix = (indexing_type == global_indexing) ? prefix : 0;
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (left_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    left_nsv[it2->second - iprefix] = it->second;
                }
                left_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            left_nsv[it->second - iprefix] = nonsv;
        }
    }

    // iterate forwards to get the nearest smaller value to the right for each element
    q.clear();
    for (size_t i = 0; i < in.size(); ++i) {
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], prefix+i, prefix);
            q.push_back(std::pair<T, size_t>(in[i], prefix+i));
        } else { // indexing_type == local_indexing
            // handle as if prefix = 0
            update_nsv_queue<T,right_type>(right_nsv, q, in[i], i, 0);
            q.push_back(std::pair<T, size_t>(in[i], i));
        }
    }

    // now go forwards through left-mins of succeeding processors
    for (size_t i = 0; i < n_right_recv; ++i) {
        size_t rcv_idx = n_left_recv + i;
        if (q.empty()) {
            break;
        }
        // set nsv for all larger elements in the queue
        if (indexing_type == global_indexing) {
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, recved[rcv_idx].second, prefix);
        } else { // indexing_type == local_indexing
            update_nsv_queue<T,right_type>(right_nsv, q, recved[rcv_idx].first, local_size+rcv_idx, 0);
        }

        if (right_type == furthest_eq) {
            if (!q.empty() && recved[rcv_idx].first == q.back().first) {
                // skip till furthest of an equal range
                while (i+1 < n_right_recv  && recved[rcv_idx].first == recved[rcv_idx+1].first) {
                    i++;
                    rcv_idx = n_left_recv + i;
                }
                // setting this as the furthest_eq for all equal elements in the queue
                // and removing all equal elements from the queue
                while (!q.empty() && q.back().first == recved[rcv_idx].first) {
                    if (indexing_type == global_indexing) {
                        right_nsv[q.back().second - prefix] = recved[rcv_idx].second;
                    } else { // indexing_type == local_indexing
                        right_nsv[q.back().second] = local_size+rcv_idx;
                    }
                    q.pop_back();
                }
            }
        }
    }

    // elements still in the queue do not have a smaller value to the left
    // -> set these to a special value and handle case if furthest_eq elements
    // are still waiting in queue
    for (auto it = q.rbegin(); it != q.rend(); ++it) {
        if (right_type == furthest_eq) {
                auto it2 = it;
                // set left most as furthest_eq for all equal elements
                while(it2+1 != q.rend() && it->first == (it2+1)->first) {
                    ++it2;
                    right_nsv[it2->second - iprefix] = it->second;
                }
                right_nsv[it->second - iprefix] = nonsv;
                it = it2;
        } else {
            right_nsv[it->second - iprefix] = nonsv;
        }
    }

    lr_mins = recved;
}